

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fhandle.h
# Opt level: O1

filehandle * __thiscall filehandle::operator=(filehandle *this,int fh)

{
  int __v;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  system_error *this_01;
  int *piVar2;
  error_category *__ecat;
  ptr *__tmp;
  
  if (fh != -1) {
    p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
    p_Var1->_M_use_count = 1;
    p_Var1->_M_weak_count = 1;
    p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00107c78;
    *(int *)&p_Var1[1]._vptr__Sp_counted_base = fh;
    (this->_p).super___shared_ptr<filehandle::ptr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)(p_Var1 + 1);
    this_00 = (this->_p).super___shared_ptr<filehandle::ptr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi;
    (this->_p).super___shared_ptr<filehandle::ptr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         p_Var1;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    return this;
  }
  this_01 = (system_error *)__cxa_allocate_exception(0x20);
  piVar2 = __errno_location();
  __v = *piVar2;
  __ecat = (error_category *)std::_V2::generic_category();
  std::system_error::system_error(this_01,__v,__ecat);
  __cxa_throw(this_01,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

filehandle& operator=(int fh)
    { 
        if (fh==-1)
            throw std::system_error(errno, std::generic_category());
        _p = std::make_shared<ptr>(fh);
        return *this;
    }